

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O0

void __thiscall simple_json::Stream::emit_json_key_object(Stream *this,string *key)

{
  bool local_1d;
  Type local_1c;
  string *local_18;
  string *key_local;
  Stream *this_local;
  
  local_18 = key;
  key_local = (string *)this;
  emit_json_key(this,key);
  statement_inner<char_const(&)[3]>(this,(char (*) [3])"{\n");
  this->indent = this->indent + 1;
  local_1c = Object;
  local_1d = false;
  std::
  stack<std::pair<simple_json::Type,bool>,std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>>
  ::emplace<simple_json::Type,bool>
            ((stack<std::pair<simple_json::Type,bool>,std::deque<std::pair<simple_json::Type,bool>,std::allocator<std::pair<simple_json::Type,bool>>>>
              *)this,&local_1c,&local_1d);
  return;
}

Assistant:

void Stream::emit_json_key_object(const std::string &key)
{
	emit_json_key(key);
	statement_inner("{\n");
	++indent;
	stack.emplace(Type::Object, false);
}